

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pthread.c
# Opt level: O3

void hd_while_pthread(hd_context *ctx)

{
  byte bVar1;
  
  bVar1 = ctx->pthread->field_0x4;
  while ((bVar1 & 4) == 0) {
    hd_warn(ctx,"consumer_eof = false, sending signal...");
    pthread_cond_signal((pthread_cond_t *)&ctx->pthread->producer_cond);
    usleep(1000);
    bVar1 = ctx->pthread->field_0x4;
  }
  return;
}

Assistant:

void
hd_while_pthread(hd_context *ctx)
{
    while(!ctx->pthread->consumer_eof)
    {
        hd_warn(ctx, "consumer_eof = false, sending signal...");
        wakeup_consumer(ctx->pthread);
        xusleep(1000);
    }
}